

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

double fcss(double *b,int pq,void *params)

{
  double *pdVar1;
  uint uVar2;
  long lVar3;
  void *__ptr;
  void *__ptr_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  uVar10 = *params;
  lVar13 = (long)(int)uVar10;
  uVar2 = *(uint *)((long)params + 8);
  uVar11 = *(uint *)((long)params + 0x18);
  lVar3 = (long)(int)uVar11;
  __ptr = malloc(lVar13 * 8);
  __ptr_00 = malloc((long)(int)uVar2 << 3);
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar10) {
    uVar4 = (ulong)uVar10;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    *(double *)((long)__ptr + uVar5 * 8) = b[uVar5];
  }
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    *(double *)((long)__ptr_00 + uVar5 * 8) = b[lVar13 + uVar5];
  }
  pdVar1 = (double *)((long)params + 0x680);
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined8 *)((long)params + uVar5 * 8 + lVar3 * 8 + 0x680) = 0;
  }
  if (*(int *)((long)params + 0x1c) == 1) {
    uVar5 = 0;
    pdVar9 = pdVar1;
    if (0 < (int)uVar11) {
      uVar5 = (ulong)uVar11;
    }
    while (bVar14 = uVar5 != 0, uVar5 = uVar5 - 1, bVar14) {
      *pdVar9 = pdVar9[(int)(uVar11 * 2)] - b[(int)(uVar2 + uVar10)];
      pdVar9 = pdVar9 + 1;
    }
  }
  lVar8 = (lVar13 << 0x20) + -0x100000000;
  lVar7 = ((ulong)(uVar11 + uVar10) << 0x20) + -0x100000000;
  dVar16 = 0.0;
  uVar10 = 0;
  dVar15 = 0.0;
  while( true ) {
    uVar11 = uVar10;
    if ((int)uVar2 < (int)uVar10) {
      uVar11 = uVar2;
    }
    if ((int)uVar11 < 1) {
      uVar11 = 0;
    }
    if (lVar3 <= lVar13) break;
    dVar17 = pdVar1[lVar13];
    lVar12 = lVar8;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      dVar17 = dVar17 - *(double *)((long)__ptr + uVar5 * 8) *
                        *(double *)((long)pdVar1 + (lVar12 >> 0x1d));
      lVar12 = lVar12 + -0x100000000;
    }
    lVar12 = lVar7;
    for (uVar5 = 0; uVar11 != uVar5; uVar5 = uVar5 + 1) {
      dVar17 = dVar17 - *(double *)((long)__ptr_00 + uVar5 * 8) *
                        *(double *)((long)pdVar1 + (lVar12 >> 0x1d));
      lVar12 = lVar12 + -0x100000000;
    }
    dVar16 = dVar16 + 1.0;
    uVar10 = uVar10 + 1;
    pdVar1[lVar3 + lVar13] = dVar17;
    dVar15 = dVar15 + dVar17 * dVar17;
    lVar13 = lVar13 + 1;
    lVar8 = lVar8 + 0x100000000;
    lVar7 = lVar7 + 0x100000000;
  }
  *(double *)((long)params + 0x30) = dVar15;
  dVar15 = log(dVar15 / dVar16);
  *(double *)((long)params + 0x38) = dVar15 * 0.5;
  free(__ptr);
  free(__ptr_00);
  return dVar15 * 0.5;
}

Assistant:

double fcss(double *b, int pq, void *params) {
	double value,ssq,temp;
	int ip, iq, N,i,ncond,j,jm,iter;
	double *phi, *theta;
	alik_css_object obj = (alik_css_object)params;

	ip = obj->p;
	iq = obj->q;

	N = obj->N;

	value = ssq = 0.0;
	ncond = ip;
	iter = 0;
	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);

	for (i = 0; i < ip; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = b[i + ip];
	}

	for (i = 0; i < ncond; ++i) {
		obj->x[N + i] = 0.0;
	}

	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[i] = obj->x[2 * N + i] - b[ip+iq];
		}
	}

	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[i];

		for (j = 0; j < ip; ++j) {
			temp = temp -  phi[j] * obj->x[i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[N + i - j - 1];
		}

		obj->x[N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	free(phi);
	free(theta);
	return value;
}